

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O2

int qc_staticlist_add_head(QcStaticList *staticList,int cell)

{
  int iVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  
  iVar3 = -1;
  if ((-1 < cell && staticList != (QcStaticList *)0x0) && (cell < staticList->limit)) {
    lVar2 = staticList->buff_offset;
    uVar4 = (ulong)(uint)cell;
    iVar1 = staticList->head;
    iVar3 = cell;
    if ((long)iVar1 == -99) {
      *(undefined8 *)((long)&staticList->head + uVar4 * 8 + lVar2) = 0xffffff9dffffff9d;
      staticList->head = cell;
      staticList->tail = cell;
      staticList->num = 1;
    }
    else {
      *(undefined4 *)((long)&staticList->head + uVar4 * 8 + lVar2) = 0xffffff9d;
      *(int *)((long)&staticList->tail + uVar4 * 8 + lVar2) = iVar1;
      *(int *)((long)&staticList->head + (long)iVar1 * 8 + lVar2) = cell;
      staticList->head = cell;
      staticList->num = staticList->num + 1;
    }
  }
  return iVar3;
}

Assistant:

int qc_staticlist_add_head(QcStaticList *staticList, int cell)
{
    _StaticCell *curCell, *headCell;

    if(NULL == staticList || cell<0 || cell>=staticList->limit)
        return -1;

    curCell = get_staticlist_cell(staticList, cell);
    if(staticList->head == QC_INVALID_INT)
    {
        curCell->previous  = QC_INVALID_INT;
        curCell->next = QC_INVALID_INT;
        staticList->head = cell;
        staticList->tail = cell;
        staticList->num = 1;
    }
    else
    {
        headCell = get_staticlist_cell(staticList, staticList->head);
        
        curCell->previous  = QC_INVALID_INT;
        curCell->next = staticList->head;
        
        headCell->previous = cell;
        staticList->head = cell;
        staticList->num ++;
    }

    return cell;
}